

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless.c
# Opt level: O0

uint32_t VP8LPredictor12_C(uint32_t *left,uint32_t *top)

{
  uint32_t uVar1;
  undefined8 in_RDI;
  uint32_t unaff_retaddr;
  uint32_t pred;
  
  uVar1 = ClampedAddSubtractFull(pred,unaff_retaddr,(uint32_t)((ulong)in_RDI >> 0x20));
  return uVar1;
}

Assistant:

uint32_t VP8LPredictor12_C(const uint32_t* const left,
                           const uint32_t* const top) {
  const uint32_t pred = ClampedAddSubtractFull(*left, top[0], top[-1]);
  return pred;
}